

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::convert_grids_to_quads
          (SceneGraph *this,Ref<embree::SceneGraph::GridMeshNode> *gmesh)

{
  uint uVar1;
  pointer *ppQVar2;
  uint uVar3;
  GridMeshNode *pGVar4;
  pointer pGVar5;
  iterator __position;
  uint uVar6;
  Node *pNVar7;
  Ref<embree::SceneGraph::GridMeshNode> *pRVar8;
  int iVar9;
  QuadMeshNode *this_00;
  undefined4 extraout_var;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  Ref<embree::SceneGraph::MaterialNode> local_70;
  int local_68;
  int local_64;
  Quad local_60;
  Node *local_50;
  Ref<embree::SceneGraph::GridMeshNode> *local_48;
  ulong local_40;
  vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
  *local_38;
  
  this_00 = (QuadMeshNode *)operator_new(0xd8);
  local_70.ptr = (gmesh->ptr->material).ptr;
  if (local_70.ptr != (MaterialNode *)0x0) {
    (*((local_70.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  QuadMeshNode::QuadMeshNode(this_00,&local_70,gmesh->ptr->time_range,0);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  local_50 = (Node *)this;
  if (local_70.ptr != (MaterialNode *)0x0) {
    (*((local_70.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  local_38 = &this_00->quads;
  uVar12 = 0;
  local_48 = gmesh;
  while( true ) {
    pRVar8 = local_48;
    iVar9 = (*(local_48->ptr->super_Node).super_RefCount._vptr_RefCount[0xe])();
    pGVar4 = pRVar8->ptr;
    if (CONCAT44(extraout_var,iVar9) <= uVar12) break;
    pGVar5 = (pGVar4->grids).
             super__Vector_base<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_64 = pGVar5[uVar12].resY - 1;
    local_40 = uVar12;
    if (local_64 != 0) {
      pGVar5 = pGVar5 + uVar12;
      uVar10 = pGVar5->startVtx;
      uVar3 = pGVar5->lineStride;
      local_68 = pGVar5->resX - 1;
      iVar11 = 0;
      uVar1 = uVar10;
      iVar9 = local_68;
      uVar6 = local_60.v0;
      do {
        for (; local_60.v0 = uVar1, iVar9 != 0; iVar9 = iVar9 + -1) {
          local_60.v3 = local_60.v0 + uVar3;
          local_60.v2 = local_60.v0 + uVar3 + 1;
          uVar1 = local_60.v0 + 1;
          __position._M_current =
               (this_00->quads).
               super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_60.v1 = uVar1;
          if (__position._M_current ==
              (this_00->quads).
              super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
            ::_M_realloc_insert<embree::SceneGraph::QuadMeshNode::Quad>
                      (local_38,__position,&local_60);
          }
          else {
            (__position._M_current)->v0 = local_60.v0;
            (__position._M_current)->v1 = uVar1;
            (__position._M_current)->v2 = local_60.v2;
            (__position._M_current)->v3 = local_60.v3;
            ppQVar2 = &(this_00->quads).
                       super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppQVar2 = *ppQVar2 + 1;
          }
          uVar6 = local_60.v0;
        }
        iVar11 = iVar11 + 1;
        uVar10 = uVar10 + uVar3;
        local_60.v0 = uVar6;
        uVar1 = uVar10;
        iVar9 = local_68;
      } while (iVar11 != local_64);
    }
    uVar12 = local_40 + 1;
  }
  lVar13 = (long)(pGVar4->positions).
                 super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(pGVar4->positions).
                 super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if (lVar13 != 0) {
    lVar13 = lVar13 >> 5;
    lVar13 = lVar13 + (ulong)(lVar13 == 0);
    lVar14 = 0;
    do {
      std::
      vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
      ::push_back(&this_00->positions,
                  (value_type *)
                  (&((pRVar8->ptr->positions).
                     super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->field_0x0 + lVar14));
      lVar14 = lVar14 + 0x20;
      lVar13 = lVar13 + -1;
    } while (lVar13 != 0);
  }
  pNVar7 = local_50;
  (local_50->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
  return (Ref<embree::SceneGraph::Node>)pNVar7;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::convert_grids_to_quads ( Ref<SceneGraph::GridMeshNode> gmesh )
  {
    Ref<SceneGraph::QuadMeshNode> qmesh = new SceneGraph::QuadMeshNode(gmesh->material,gmesh->time_range,0);

    for (size_t i=0; i<gmesh->numPrimitives(); i++)
    {
      const unsigned int startVtx = gmesh->grids[i].startVtx;
      const unsigned int lineStride = gmesh->grids[i].lineStride;
      const unsigned int resX = gmesh->grids[i].resX;
      const unsigned int resY = gmesh->grids[i].resY;

      for (unsigned int y=0; y<resY-1; y++)
      {
        for (unsigned int x=0; x<resX-1; x++)
        {
          const unsigned int a0 = startVtx + y * lineStride + x;
          const unsigned int a1 = a0 + 1;
          const unsigned int a3 = a0 + lineStride;
          const unsigned int a2 = a0 + lineStride + 1;
          qmesh->quads.push_back(SceneGraph::QuadMeshNode::Quad(a0,a1,a2,a3));
        }
      }
    }
    const size_t timeSteps = gmesh->positions.size();
    for (size_t t=0;t<timeSteps;t++)
      qmesh->positions.push_back(gmesh->positions[t]);
    return qmesh.dynamicCast<SceneGraph::Node>();
  }